

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_sort(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSAtomStruct *pJVar1;
  JSRuntime *pJVar2;
  int64_t iVar3;
  int iVar4;
  undefined8 *puVar5;
  size_t idx;
  ulong uVar6;
  long lVar7;
  ulong nmemb;
  int64_t iVar8;
  ulong uVar9;
  JSValue *pval;
  JSValueUnion JVar10;
  JSValue v;
  JSValue v_00;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue obj;
  JSValue JVar11;
  JSValue JVar12;
  JSValue val;
  size_t slack;
  int64_t len;
  array_sort_context asc;
  undefined8 *local_80;
  JSValueUnion local_78;
  JSValueUnion local_70;
  int64_t local_68;
  long local_60;
  size_t local_58;
  JSContext *local_50;
  undefined8 local_48;
  JSValueUnion local_40;
  int64_t iStack_38;
  
  local_48 = 0;
  local_40 = argv->u;
  iStack_38 = argv->tag;
  local_50 = ctx;
  if ((int)iStack_38 == 3) {
LAB_00166be1:
    JVar11 = JS_ToObject(ctx,this_val);
    iVar8 = JVar11.tag;
    local_70 = JVar11.u;
    iVar4 = js_get_length64(ctx,(int64_t *)&local_58,JVar11);
    uVar6 = 0;
    if (iVar4 == 0) {
      local_68 = iVar8;
      if ((long)local_58 < 1) {
        local_60 = 0;
        nmemb = 0;
        local_80 = (undefined8 *)0x0;
      }
      else {
        local_80 = (undefined8 *)0x0;
        uVar9 = 0;
        nmemb = 0;
        local_60 = 0;
        lVar7 = 0;
        do {
          puVar5 = local_80;
          if (uVar9 <= nmemb) {
            uVar9 = (uVar9 >> 1) + uVar9 + 0x1f & 0xfffffffffffffff0;
            puVar5 = (undefined8 *)js_realloc2(ctx,local_80,uVar9 << 5,(size_t *)&local_78.int32);
            uVar9 = ((ulong)local_78.ptr >> 5) + uVar9;
            if (puVar5 == (undefined8 *)0x0) goto LAB_00166d50;
          }
          local_80 = puVar5;
          uVar6 = 0;
          pval = (JSValue *)(local_80 + nmemb * 4);
          JVar11.tag = local_68;
          JVar11.u.float64 = local_70.float64;
          iVar4 = JS_TryGetPropertyInt64(ctx,JVar11,lVar7,pval);
          iVar8 = local_68;
          if (iVar4 < 0) goto LAB_00166d52;
          if (iVar4 != 0) {
            if ((int)pval->tag == 3) {
              local_60 = local_60 + 1;
            }
            else {
              pval[1].u.float64 = 0.0;
              pval[1].tag = lVar7;
              nmemb = nmemb + 1;
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (long)local_58);
      }
      rqsort(local_80,nmemb,0x20,js_array_cmp_generic,&local_50);
      iVar8 = local_68;
      if ((int)local_48 == 0) {
        if (nmemb == 0) {
          nmemb = 0;
        }
        else {
          idx = 0;
          puVar5 = local_80;
          do {
            pJVar1 = (JSAtomStruct *)puVar5[2];
            if ((pJVar1 != (JSAtomStruct *)0x0) &&
               (iVar4 = (pJVar1->header).ref_count, (pJVar1->header).ref_count = iVar4 + -1,
               iVar4 < 2)) {
              pJVar2 = ctx->rt;
              if (*(ulong *)&pJVar1->field_0x4 < 0x4000000000000000) {
                (*(pJVar2->mf).js_free)(&pJVar2->malloc_state,pJVar1);
              }
              else {
                JS_FreeAtomStruct(pJVar2,pJVar1);
              }
            }
            iVar3 = puVar5[1];
            if (idx == puVar5[3]) {
              local_78.ptr = (void *)*puVar5;
              if ((0xfffffff4 < (uint)iVar3) &&
                 (iVar4 = *local_78.ptr, *(int *)local_78.ptr = iVar4 + -1, iVar4 < 2)) {
                v_00.tag = iVar3;
                v_00.u.ptr = local_78.ptr;
                __JS_FreeValueRT(ctx->rt,v_00);
              }
            }
            else {
              this_obj.tag = iVar8;
              this_obj.u.ptr = local_70.ptr;
              val.tag = iVar3;
              val.u.ptr = (void *)*puVar5;
              iVar4 = JS_SetPropertyInt64(ctx,this_obj,idx,val);
              if (iVar4 < 0) {
                uVar6 = idx + 1;
                goto LAB_00166d52;
              }
            }
            idx = idx + 1;
            puVar5 = puVar5 + 4;
          } while (nmemb != idx);
        }
        (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,local_80);
        JVar10 = local_70;
        lVar7 = local_60;
        if (0 < local_60) {
          do {
            this_obj_00.tag = iVar8;
            this_obj_00.u.ptr = JVar10.ptr;
            iVar4 = JS_SetPropertyInt64(ctx,this_obj_00,nmemb,(JSValue)(ZEXT816(3) << 0x40));
            if (iVar4 < 0) goto LAB_00166df7;
            nmemb = nmemb + 1;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        if ((long)nmemb < (long)local_58) {
          do {
            obj.tag = iVar8;
            obj.u.ptr = JVar10.ptr;
            iVar4 = JS_DeletePropertyInt64(ctx,obj,nmemb,0x4000);
            if (iVar4 < 0) goto LAB_00166df7;
            nmemb = nmemb + 1;
          } while (local_58 != nmemb);
        }
        goto LAB_00166e2d;
      }
LAB_00166d50:
      uVar6 = 0;
      iVar8 = local_68;
    }
    else {
      nmemb = 0;
      local_80 = (undefined8 *)0x0;
    }
  }
  else {
    iVar4 = check_function(ctx,*argv);
    if (iVar4 == 0) {
      local_48 = CONCAT44(1,(int)local_48);
      goto LAB_00166be1;
    }
    uVar6 = 0;
    nmemb = 0;
    local_80 = (undefined8 *)0x0;
    local_70.float64 = 0.0;
    iVar8 = 3;
  }
LAB_00166d52:
  lVar7 = nmemb - uVar6;
  if (uVar6 <= nmemb && lVar7 != 0) {
    puVar5 = local_80 + uVar6 * 4 + 2;
    do {
      local_78 = (JSValueUnion)((JSValueUnion *)(puVar5 + -2))->ptr;
      JVar11 = *(JSValue *)(puVar5 + -2);
      if ((0xfffffff4 < (uint)puVar5[-1]) &&
         (iVar4 = *local_78.ptr, *(int *)local_78.ptr = iVar4 + -1, iVar4 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar11);
      }
      pJVar1 = (JSAtomStruct *)*puVar5;
      if ((pJVar1 != (JSAtomStruct *)0x0) &&
         (iVar4 = (pJVar1->header).ref_count, (pJVar1->header).ref_count = iVar4 + -1, iVar4 < 2)) {
        pJVar2 = ctx->rt;
        if (*(ulong *)&pJVar1->field_0x4 < 0x4000000000000000) {
          (*(pJVar2->mf).js_free)(&pJVar2->malloc_state,pJVar1);
        }
        else {
          JS_FreeAtomStruct(pJVar2,pJVar1);
        }
      }
      puVar5 = puVar5 + 4;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,local_80);
  JVar10 = local_70;
LAB_00166df7:
  if ((0xfffffff4 < (uint)iVar8) &&
     (iVar4 = *JVar10.ptr, *(int *)JVar10.ptr = iVar4 + -1, iVar4 < 2)) {
    v.tag = iVar8;
    v.u.ptr = JVar10.ptr;
    local_78 = JVar10;
    __JS_FreeValueRT(ctx->rt,v);
  }
  iVar8 = 6;
  JVar10.float64 = 0.0;
LAB_00166e2d:
  JVar12.tag = iVar8;
  JVar12.u.float64 = JVar10.float64;
  return JVar12;
}

Assistant:

static JSValue js_array_sort(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    struct array_sort_context asc = { ctx, 0, 0, argv[0] };
    JSValue obj = JS_UNDEFINED;
    ValueSlot *array = NULL;
    size_t array_size = 0, pos = 0, n = 0;
    int64_t i, len, undefined_count = 0;
    int present;

    if (!JS_IsUndefined(asc.method)) {
        if (check_function(ctx, asc.method))
            goto exception;
        asc.has_method = 1;
    }
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    /* XXX: should special case fast arrays */
    for (i = 0; i < len; i++) {
        if (pos >= array_size) {
            size_t new_size, slack;
            ValueSlot *new_array;
            new_size = (array_size + (array_size >> 1) + 31) & ~15;
            new_array = js_realloc2(ctx, array, new_size * sizeof(*array), &slack);
            if (new_array == NULL)
                goto exception;
            new_size += slack / sizeof(*new_array);
            array = new_array;
            array_size = new_size;
        }
        present = JS_TryGetPropertyInt64(ctx, obj, i, &array[pos].val);
        if (present < 0)
            goto exception;
        if (present == 0)
            continue;
        if (JS_IsUndefined(array[pos].val)) {
            undefined_count++;
            continue;
        }
        array[pos].str = NULL;
        array[pos].pos = i;
        pos++;
    }
    rqsort(array, pos, sizeof(*array), js_array_cmp_generic, &asc);
    if (asc.exception)
        goto exception;

    /* XXX: should special case fast arrays */
    while (n < pos) {
        if (array[n].str)
            JS_FreeValue(ctx, JS_MKPTR(JS_TAG_STRING, array[n].str));
        if (array[n].pos == n) {
            JS_FreeValue(ctx, array[n].val);
        } else {
            if (JS_SetPropertyInt64(ctx, obj, n, array[n].val) < 0) {
                n++;
                goto exception;
            }
        }
        n++;
    }
    js_free(ctx, array);
    for (i = n; undefined_count-- > 0; i++) {
        if (JS_SetPropertyInt64(ctx, obj, i, JS_UNDEFINED) < 0)
            goto fail;
    }
    for (; i < len; i++) {
        if (JS_DeletePropertyInt64(ctx, obj, i, JS_PROP_THROW) < 0)
            goto fail;
    }
    return obj;

exception:
    for (; n < pos; n++) {
        JS_FreeValue(ctx, array[n].val);
        if (array[n].str)
            JS_FreeValue(ctx, JS_MKPTR(JS_TAG_STRING, array[n].str));
    }
    js_free(ctx, array);
fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}